

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::Generators::GeneratorUntypedBase::~GeneratorUntypedBase(GeneratorUntypedBase *this)

{
  this->_vptr_GeneratorUntypedBase = (_func_int **)&PTR___cxa_pure_virtual_001a43f8;
  std::__cxx11::string::~string((string *)&this->m_stringReprCache);
  return;
}

Assistant:

GeneratorUntypedBase::~GeneratorUntypedBase() = default;